

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O3

void __thiscall Rml::XMLParser::~XMLParser(XMLParser *this)

{
  DocumentHeader *__ptr;
  
  (this->super_BaseXMLParser)._vptr_BaseXMLParser = (_func_int **)&PTR__XMLParser_00331ce8;
  ::std::deque<Rml::XMLParser::ParseFrame,_std::allocator<Rml::XMLParser::ParseFrame>_>::~deque
            (&(this->stack).c);
  __ptr = (this->header)._M_t.
          super___uniq_ptr_impl<Rml::DocumentHeader,_std::default_delete<Rml::DocumentHeader>_>._M_t
          .super__Tuple_impl<0UL,_Rml::DocumentHeader_*,_std::default_delete<Rml::DocumentHeader>_>.
          super__Head_base<0UL,_Rml::DocumentHeader_*,_false>._M_head_impl;
  if (__ptr != (DocumentHeader *)0x0) {
    ::std::default_delete<Rml::DocumentHeader>::operator()
              ((default_delete<Rml::DocumentHeader> *)&this->header,__ptr);
  }
  (this->header)._M_t.
  super___uniq_ptr_impl<Rml::DocumentHeader,_std::default_delete<Rml::DocumentHeader>_>._M_t.
  super__Tuple_impl<0UL,_Rml::DocumentHeader_*,_std::default_delete<Rml::DocumentHeader>_>.
  super__Head_base<0UL,_Rml::DocumentHeader_*,_false>._M_head_impl = (DocumentHeader *)0x0;
  BaseXMLParser::~BaseXMLParser(&this->super_BaseXMLParser);
  return;
}

Assistant:

XMLParser::~XMLParser() {}